

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::TestInfoImpl::Run(TestInfoImpl *this)

{
  TestEventRepeater *pTVar1;
  bool bVar2;
  int iVar3;
  UnitTestImpl *this_00;
  TimeInMillis TVar4;
  OsStackTraceGetterInterface *pOVar5;
  undefined4 extraout_var;
  TimeInMillis TVar6;
  Test *this_01;
  
  if (this->should_run_ == true) {
    this_00 = GetUnitTestImpl();
    this_00->current_test_info_ = this->parent_;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this->parent_);
    TVar4 = GetTimeInMillis();
    pOVar5 = UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
    iVar3 = (*this->factory_->_vptr_TestFactoryBase[2])();
    this_01 = (Test *)CONCAT44(extraout_var,iVar3);
    bVar2 = Test::HasFatalFailure();
    if (!bVar2) {
      Test::Run(this_01);
    }
    pOVar5 = UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
    if (this_01 != (Test *)0x0) {
      (*this_01->_vptr_Test[1])(this_01);
    }
    TVar6 = GetTimeInMillis();
    (this->result_).elapsed_time_ = TVar6 - TVar4;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[9])(pTVar1,this->parent_);
    this_00->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfoImpl::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(parent_);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*parent_);

  const TimeInMillis start = GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();
#if GTEST_HAS_SEH
  // Catch SEH-style exceptions.
  Test* test = NULL;

  __try {
    // Creates the test object.
    test = factory_->CreateTest();
  } __except(internal::UnitTestOptions::GTestShouldProcessSEH(
      GetExceptionCode())) {
    AddExceptionThrownFailure(GetExceptionCode(),
                              "the test fixture's constructor");
    return;
  }
#else  // We are on a compiler or platform that doesn't support SEH.

  // TODO(wan): If test->Run() throws, test won't be deleted.  This is
  // not a problem now as we don't use exceptions.  If we were to
  // enable exceptions, we should revise the following to be
  // exception-safe.

  // Creates the test object.
  Test* test = factory_->CreateTest();
#endif  // GTEST_HAS_SEH

  // Runs the test only if the constructor of the test fixture didn't
  // generate a fatal failure.
  if (!Test::HasFatalFailure()) {
    test->Run();
  }

  // Deletes the test object.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  delete test;
  test = NULL;

  result_.set_elapsed_time(GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*parent_);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}